

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt slang::SVInt::fromDecimalDigits
                (bitwidth_t bits,bool isSigned,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  byte bVar1;
  size_type sVar2;
  byte in_DL;
  undefined8 extraout_RDX;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  __type_conflict3 _Var3;
  SVInt SVar4;
  size_t j_1;
  size_t j;
  size_t i;
  anon_class_32_4_88832beb writeWord;
  anon_class_8_1_54a39804 nextDigit;
  uint64_t word;
  uint32_t count;
  uint64_t maxWord;
  logic_t *d;
  int charsPerWord;
  SVInt *result;
  anon_class_32_4_88832beb *in_stack_ffffffffffffff30;
  bool in_stack_ffffffffffffff4a;
  bool in_stack_ffffffffffffff4b;
  bitwidth_t in_stack_ffffffffffffff4c;
  long local_90;
  long local_88;
  ulong local_80;
  anon_class_8_1_54a39804 *this;
  ulong local_50;
  anon_class_8_1_54a39804 local_48 [2];
  ulong local_38;
  pointer local_30;
  undefined4 local_24;
  undefined1 local_1e;
  byte local_1d;
  span<const_slang::logic_t,_18446744073709551615UL> local_18;
  
  local_1d = in_DL & 1;
  local_1e = 0;
  allocZeroed(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff4b,in_stack_ffffffffffffff4a);
  local_24 = 0x12;
  local_30 = std::span<const_slang::logic_t,_18446744073709551615UL>::data(&local_18);
  _Var3 = std::pow<int,int>(0,0x34e76e);
  local_38 = (long)_Var3 | (long)(_Var3 - 9.223372036854776e+18) & (long)_Var3 >> 0x3f;
  local_48[0].d._0_4_ = 0;
  this = local_48;
  for (local_80 = 0x12;
      sVar2 = std::span<const_slang::logic_t,_18446744073709551615UL>::size
                        ((span<const_slang::logic_t,_18446744073709551615UL> *)0x34e816),
      local_80 < sVar2; local_80 = local_80 + 0x12) {
    fromDecimalDigits::anon_class_8_1_54a39804::operator()(this);
    for (local_88 = 0x11; local_88 != 0; local_88 = local_88 + -1) {
      fromDecimalDigits::anon_class_8_1_54a39804::operator()(this);
    }
    fromDecimalDigits::anon_class_32_4_88832beb::operator()(in_stack_ffffffffffffff30);
  }
  local_38 = 10;
  bVar1 = fromDecimalDigits::anon_class_8_1_54a39804::operator()(this);
  local_50 = (ulong)bVar1;
  sVar2 = std::span<const_slang::logic_t,_18446744073709551615UL>::size
                    ((span<const_slang::logic_t,_18446744073709551615UL> *)0x34e927);
  local_90 = sVar2 - (local_80 - 0x12);
  while (local_90 = local_90 + -1, local_90 != 0) {
    in_stack_ffffffffffffff30 = (anon_class_32_4_88832beb *)(local_50 * 10);
    bVar1 = fromDecimalDigits::anon_class_8_1_54a39804::operator()(this);
    local_50 = (long)&in_stack_ffffffffffffff30->count + (ulong)bVar1;
    local_38 = local_38 * 10;
  }
  fromDecimalDigits::anon_class_32_4_88832beb::operator()(in_stack_ffffffffffffff30);
  SVar4.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar4.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar4.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar4.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar4.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar4.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDecimalDigits(bitwidth_t bits, bool isSigned, std::span<logic_t const> digits) {
    SVInt result = allocZeroed(bits, isSigned, false);

    constexpr int charsPerWord = 18; // 18 decimal digits can fit in a 64-bit word
    const logic_t* d = digits.data();
    uint64_t maxWord = (uint64_t)std::pow(10, charsPerWord);
    uint32_t count = 0;
    uint64_t word;

    auto nextDigit = [&]() {
        uint8_t v = d->value;
        if (v >= 10) {
            SLANG_THROW(
                std::invalid_argument(fmt::format("Digit {} too large for radix {}", v, 10)));
        }
        d++;
        return v;
    };

    auto writeWord = [&]() {
        if (!count) {
            if (word)
                result.pVal[count++] = word;
        }
        else {
            uint64_t carry = mulOne(result.pVal, result.pVal, count, maxWord);
            carry += addOne(result.pVal, result.pVal, count, word);
            if (carry)
                result.pVal[count++] = carry;
        }
    };

    size_t i;
    for (i = charsPerWord; i < digits.size(); i += charsPerWord) {
        word = nextDigit();
        for (size_t j = charsPerWord - 1; j != 0; j--)
            word = word * 10 + nextDigit();

        writeWord();
    }

    maxWord = 10;
    word = nextDigit();

    for (size_t j = digits.size() - (i - charsPerWord) - 1; j > 0; j--) {
        word = word * 10 + nextDigit();
        maxWord *= 10;
    }

    writeWord();

    return result;
}